

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsStorage.cpp
# Opt level: O3

void __thiscall
vkt::sparse::SparseShaderIntrinsicsInstanceStorage::recordCommands
          (SparseShaderIntrinsicsInstanceStorage *this,VkCommandBuffer commandBuffer,
          VkImageCreateInfo *imageSparseInfo,VkImage imageSparse,VkImage imageTexels,
          VkImage imageResidency)

{
  Move<vk::Handle<(vk::HandleType)21>_> *pMVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  DeviceDriver *vk;
  VkDescriptorPool obj;
  VkDevice pVVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  pointer pSVar5;
  long *plVar6;
  pointer pSVar7;
  pointer pSVar8;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkImageSubresourceRange subresourceRange_02;
  VkImageSubresourceRange subresourceRange_03;
  VkImageSubresourceRange subresourceRange_04;
  VkImageSubresourceRange subresourceRange_05;
  VkImageSubresourceRange subresourceRange_06;
  VkImageCreateInfo *pVVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  pointer pWVar12;
  pointer pVVar13;
  bool bVar14;
  VkFormat VVar15;
  VkDescriptorType VVar16;
  VkImageViewType VVar17;
  uint uVar18;
  InstanceInterface *instance;
  VkPhysicalDevice physicalDevice;
  const_iterator cVar19;
  deUint64 *pdVar20;
  long *plVar21;
  int *piVar22;
  NotSupportedError *this_01;
  TestError *this_02;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  undefined8 *puVar26;
  pointer_____offset_0x10___ *ppuVar27;
  DescriptorSetUpdateBuilder *pDVar28;
  undefined8 *puVar29;
  uint uVar30;
  byte bVar31;
  UVec3 gridSize;
  VkDescriptorSet descriptorSet;
  DescriptorPoolBuilder descriptorPoolBuilder;
  UVec3 specializationData [2];
  VkSpecializationInfo specializationInfo;
  VkSpecializationMapEntry specializationMapEntries [6];
  VkDescriptorImageInfo imageResidencyDescInfo;
  VkDescriptorImageInfo imageTexelsDescInfo;
  VkDescriptorImageInfo imageSparseDescInfo;
  DescriptorSetLayoutBuilder descriptorLayerBuilder;
  VkImageMemoryBarrier imageShaderAccessBarriers [3];
  uint local_4c4;
  uint uStack_4c0;
  uint local_4bc;
  VkImageCreateInfo *local_4b8;
  ulong local_4b0;
  undefined8 local_4a8;
  VkImage local_4a0;
  VkImage local_498;
  deUint32 local_48c;
  deUint32 local_488;
  uint local_484;
  uint local_480;
  uint local_47c;
  Move<vk::Handle<(vk::HandleType)22>_> local_478;
  VkImage local_458;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  *local_450;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  *local_448;
  DescriptorPoolBuilder local_440;
  Move<vk::Handle<(vk::HandleType)13>_> local_428;
  Move<vk::Handle<(vk::HandleType)13>_> local_408;
  Move<vk::Handle<(vk::HandleType)13>_> local_3e8;
  Move<vk::Handle<(vk::HandleType)18>_> local_3c8;
  undefined8 local_3a8;
  deUint32 dStack_3a0;
  undefined4 uStack_39c;
  deUint32 local_398;
  undefined8 local_390;
  deUint32 dStack_388;
  undefined4 uStack_384;
  deUint32 local_380;
  undefined4 local_378;
  undefined4 uStack_374;
  undefined8 uStack_370;
  deUint32 local_368;
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined8 uStack_358;
  deUint32 local_350;
  undefined4 local_348;
  undefined4 uStack_344;
  undefined8 uStack_340;
  deUint32 local_338;
  undefined8 local_330;
  deUint32 dStack_328;
  undefined4 uStack_324;
  deUint32 local_320;
  undefined8 local_318;
  deUint32 dStack_310;
  undefined4 uStack_30c;
  deUint32 local_308;
  undefined8 local_300;
  deUint32 dStack_2f8;
  undefined4 uStack_2f4;
  deUint32 local_2f0;
  undefined1 local_2e8 [8];
  uint local_2e0;
  uint local_2dc;
  uint local_2d8;
  uint local_2d4;
  VkCommandBuffer local_2d0;
  UVec3 *local_2c8;
  TextureFormat *local_2c0;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  *local_2b8;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  *local_2b0;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  *local_2a8;
  undefined1 local_2a0 [64];
  deUint32 local_260;
  VkPipelineLayout local_258;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_250;
  VkDescriptorSetLayout local_238;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_230;
  VkShaderModule local_218;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_210;
  undefined1 local_1f8 [16];
  pointer local_1e8;
  pointer pVStack_1e0;
  deUint32 local_1b8;
  undefined8 local_198;
  undefined8 local_190;
  undefined4 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined4 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined4 local_158;
  DescriptorSetLayoutBuilder local_150;
  DescriptorSetUpdateBuilder local_108;
  undefined8 local_c0 [8];
  deUint32 local_80;
  undefined8 local_78 [8];
  deUint32 local_38;
  
  bVar31 = 0;
  local_4a0.m_internal = imageResidency.m_internal;
  local_498.m_internal = imageTexels.m_internal;
  local_458.m_internal = imageSparse.m_internal;
  instance = Context::getInstanceInterface
                       ((this->super_SparseShaderIntrinsicsInstanceBase).
                        super_SparseResourcesBaseInstance.super_TestInstance.m_context);
  vk = (this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
       m_deviceDriver.super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.
       m_data.ptr;
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance
                  .super_TestInstance.m_context);
  bVar14 = checkImageFormatFeatureSupport(instance,physicalDevice,imageSparseInfo->format,2);
  if (bVar14) {
    local_2c0 = &(this->super_SparseShaderIntrinsicsInstanceBase).m_residencyFormat;
    VVar15 = ::vk::mapTextureFormat(local_2c0);
    bVar14 = checkImageFormatFeatureSupport(instance,physicalDevice,VVar15,2);
    if (bVar14) {
      local_448 = &(this->super_SparseShaderIntrinsicsInstanceBase).pipelines;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
      ::resize(local_448,(ulong)imageSparseInfo->mipLevels);
      local_2a8 = &(this->super_SparseShaderIntrinsicsInstanceBase).descriptorSets;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
      ::resize(local_2a8,(ulong)imageSparseInfo->mipLevels);
      local_2b0 = &(this->super_SparseShaderIntrinsicsInstanceBase).imageSparseViews;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ::resize(local_2b0,(ulong)imageSparseInfo->mipLevels);
      local_2b8 = &(this->super_SparseShaderIntrinsicsInstanceBase).imageTexelsViews;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ::resize(local_2b8,(ulong)imageSparseInfo->mipLevels);
      local_450 = &(this->super_SparseShaderIntrinsicsInstanceBase).imageResidencyViews;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ::resize(local_450,(ulong)imageSparseInfo->mipLevels);
      ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_150);
      VVar16 = (*(this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
                 super_TestInstance._vptr_TestInstance[7])(this);
      ::vk::DescriptorSetLayoutBuilder::addBinding(&local_150,VVar16,1,0x20,(VkSampler *)0x0);
      ::vk::DescriptorSetLayoutBuilder::addBinding
                (&local_150,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
      ::vk::DescriptorSetLayoutBuilder::addBinding
                (&local_150,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
      ::vk::DescriptorSetLayoutBuilder::build
                ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_108,&local_150,
                 &vk->super_DeviceInterface,
                 (this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
                 m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,0);
      DStack_230.m_device =
           (VkDevice)
           local_108.m_writeDescriptorInfos.
           super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      DStack_230.m_allocator =
           (VkAllocationCallbacks *)
           local_108.m_writes.
           super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_238.m_internal =
           (deUint64)
           local_108.m_writeDescriptorInfos.
           super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      DStack_230.m_deviceIface =
           (DeviceInterface *)
           local_108.m_writeDescriptorInfos.
           super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&local_108,
                         &vk->super_DeviceInterface,
                         (this->super_SparseShaderIntrinsicsInstanceBase).
                         super_SparseResourcesBaseInstance.m_logicalDevice.
                         super_RefBase<vk::VkDevice_s_*>.m_data.object,
                         (VkDescriptorSetLayout)
                         local_108.m_writeDescriptorInfos.
                         super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      DStack_250.m_device =
           (VkDevice)
           local_108.m_writeDescriptorInfos.
           super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      DStack_250.m_allocator =
           (VkAllocationCallbacks *)
           local_108.m_writes.
           super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_258.m_internal =
           (deUint64)
           local_108.m_writeDescriptorInfos.
           super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      DStack_250.m_deviceIface =
           (DeviceInterface *)
           local_108.m_writeDescriptorInfos.
           super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&local_440);
      VVar16 = (*(this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
                 super_TestInstance._vptr_TestInstance[7])();
      ::vk::DescriptorPoolBuilder::addType(&local_440,VVar16,imageSparseInfo->mipLevels);
      ::vk::DescriptorPoolBuilder::addType
                (&local_440,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,imageSparseInfo->mipLevels);
      ::vk::DescriptorPoolBuilder::addType
                (&local_440,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,imageSparseInfo->mipLevels);
      ::vk::DescriptorPoolBuilder::build
                ((Move<vk::Handle<(vk::HandleType)21>_> *)local_1f8,&local_440,
                 &vk->super_DeviceInterface,
                 (this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
                 m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,1,
                 imageSparseInfo->mipLevels);
      pVVar13 = pVStack_1e0;
      pWVar12 = local_1e8;
      uVar11 = local_1f8._8_8_;
      uVar10 = local_1f8._0_8_;
      local_108.m_writeDescriptorInfos.
      super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1e8;
      local_108.m_writes.
      super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
      _M_impl.super__Vector_impl_data._M_start = pVStack_1e0;
      local_108.m_writeDescriptorInfos.
      super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1f8._0_8_;
      local_108.m_writeDescriptorInfos.
      super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1f8._8_8_;
      local_1f8._0_8_ = 0;
      local_1f8._8_8_ = (DeviceInterface *)0x0;
      local_1e8 = (pointer)0x0;
      pVStack_1e0 = (pointer)0x0;
      pMVar1 = &(this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool;
      obj.m_internal =
           (this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool.
           super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
      if (obj.m_internal == 0) {
        (this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool.
        super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)pWVar12;
        (this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool.
        super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)pVVar13;
        (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal = uVar10;
        (this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool.
        super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)uVar11;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  (&(this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool.
                    super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter,obj);
        (this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool.
        super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
             (VkDevice)
             local_108.m_writeDescriptorInfos.
             super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool.
        super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)
             local_108.m_writes.
             super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
             (deUint64)
             local_108.m_writeDescriptorInfos.
             super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool.
        super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)
             local_108.m_writeDescriptorInfos.
             super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (local_1f8._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)21>_> *)(local_1f8 + 8),
                     (VkDescriptorPool)local_1f8._0_8_);
        }
      }
      dVar2 = imageSparseInfo->mipLevels;
      dVar3 = imageSparseInfo->arrayLayers;
      local_300 = 1;
      uStack_2f4 = 0;
      subresourceRange.levelCount = dVar2;
      subresourceRange.aspectMask = 1;
      subresourceRange.baseMipLevel = 0;
      subresourceRange.baseArrayLayer = 0;
      subresourceRange.layerCount = dVar3;
      dStack_2f8 = dVar2;
      local_2f0 = dVar3;
      makeImageMemoryBarrier
                ((VkImageMemoryBarrier *)local_1f8,0x1000,0x20,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                 VK_IMAGE_LAYOUT_GENERAL,local_458,subresourceRange);
      puVar26 = (undefined8 *)local_1f8;
      pDVar28 = &local_108;
      for (lVar24 = 8; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pDVar28->m_writeDescriptorInfos).
        super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar26;
        puVar26 = puVar26 + (ulong)bVar31 * -2 + 1;
        pDVar28 = (DescriptorSetUpdateBuilder *)((long)pDVar28 + ((ulong)bVar31 * -2 + 1) * 8);
      }
      local_108.m_copies.
      super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = local_1b8;
      local_318 = 1;
      uStack_30c = 0;
      subresourceRange_00.levelCount = dVar2;
      subresourceRange_00.aspectMask = 1;
      subresourceRange_00.baseMipLevel = 0;
      subresourceRange_00.baseArrayLayer = 0;
      subresourceRange_00.layerCount = dVar3;
      dStack_310 = dVar2;
      local_308 = dVar3;
      makeImageMemoryBarrier
                ((VkImageMemoryBarrier *)local_1f8,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
                 VK_IMAGE_LAYOUT_GENERAL,local_498,subresourceRange_00);
      puVar26 = (undefined8 *)local_1f8;
      puVar29 = local_c0;
      for (lVar24 = 8; lVar24 != 0; lVar24 = lVar24 + -1) {
        *puVar29 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar31 * -2 + 1;
        puVar29 = puVar29 + (ulong)bVar31 * -2 + 1;
      }
      local_80 = local_1b8;
      local_330 = 1;
      uStack_324 = 0;
      subresourceRange_01.levelCount = dVar2;
      subresourceRange_01.aspectMask = 1;
      subresourceRange_01.baseMipLevel = 0;
      subresourceRange_01.baseArrayLayer = 0;
      subresourceRange_01.layerCount = dVar3;
      local_488 = dVar2;
      dStack_328 = dVar2;
      local_320 = dVar3;
      makeImageMemoryBarrier
                ((VkImageMemoryBarrier *)local_1f8,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
                 VK_IMAGE_LAYOUT_GENERAL,local_4a0,subresourceRange_01);
      puVar26 = (undefined8 *)local_1f8;
      puVar29 = local_78;
      for (lVar24 = 8; lVar24 != 0; lVar24 = lVar24 + -1) {
        *puVar29 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar31 * -2 + 1;
        puVar29 = puVar29 + (ulong)bVar31 * -2 + 1;
      }
      local_38 = local_1b8;
      local_4b8 = imageSparseInfo;
      local_48c = dVar3;
      (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                (vk,commandBuffer,0x1000,0x800,0,0,0,0,0,3,&local_108);
      puVar26 = &DAT_00b43b20;
      puVar29 = (undefined8 *)local_1f8;
      for (lVar24 = 0xc; lVar24 != 0; lVar24 = lVar24 + -1) {
        *puVar29 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar31 * -2 + 1;
        puVar29 = puVar29 + (ulong)bVar31 * -2 + 1;
      }
      pVVar4 = (this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
               m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object;
      this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                 *)((this->super_SparseShaderIntrinsicsInstanceBase).
                    super_SparseResourcesBaseInstance.super_TestInstance.m_context)->
                   m_progCollection;
      local_2a0._0_8_ = local_2a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"compute","");
      cVar19 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               ::find(this_00,(key_type *)local_2a0);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&local_108,&vk->super_DeviceInterface,
                 pVVar4,*(ProgramBinary **)(cVar19._M_node + 2),0);
      DStack_210.m_device =
           (VkDevice)
           local_108.m_writeDescriptorInfos.
           super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      DStack_210.m_allocator =
           (VkAllocationCallbacks *)
           local_108.m_writes.
           super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_218.m_internal =
           (deUint64)
           local_108.m_writeDescriptorInfos.
           super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      DStack_210.m_deviceIface =
           (DeviceInterface *)
           local_108.m_writeDescriptorInfos.
           super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_108.m_writeDescriptorInfos.
      super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.m_writeDescriptorInfos.
      super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.m_writeDescriptorInfos.
      super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_108.m_writes.
      super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
        operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
      }
      if (local_4b8->mipLevels != 0) {
        local_2c8 = &(this->super_SparseShaderIntrinsicsInstanceBase).m_imageSize;
        lVar24 = 0;
        uVar25 = 0;
        local_2d0 = commandBuffer;
        do {
          local_4b0 = uVar25;
          getShaderGridSize((sparse *)&local_4c4,
                            (this->super_SparseShaderIntrinsicsInstanceBase).m_imageType,local_2c8,
                            (deUint32)uVar25);
          local_47c = local_4c4;
          if (0x7f < local_4c4) {
            local_47c = 0x80;
          }
          uVar23 = (uint)(byte)(0x80 / (byte)local_47c);
          uVar18 = uStack_4c0;
          if (uVar23 <= uStack_4c0) {
            uVar18 = uVar23;
          }
          uVar23 = 0x80 / (uVar18 * local_47c & 0xffff);
          local_480 = local_4bc;
          if (uVar23 <= local_4bc) {
            local_480 = uVar23;
          }
          if (0x3f < local_480) {
            local_480 = 0x40;
          }
          local_2e0 = local_4bc;
          local_2a0._0_4_ = 6;
          local_2a0._8_8_ = local_1f8;
          local_2a0._16_8_ = 0x18;
          local_2a0._24_8_ = local_2e8;
          local_2dc = local_47c;
          local_2d8 = uVar18;
          local_2d4 = local_480;
          makeComputePipeline(&local_3c8,&vk->super_DeviceInterface,
                              (this->super_SparseShaderIntrinsicsInstanceBase).
                              super_SparseResourcesBaseInstance.m_logicalDevice.
                              super_RefBase<vk::VkDevice_s_*>.m_data.object,local_258,local_218,
                              (VkSpecializationInfo *)local_2a0);
          pdVar20 = (deUint64 *)operator_new(0x20);
          pdVar20[2] = (deUint64)
                       local_3c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                       m_device;
          pdVar20[3] = (deUint64)
                       local_3c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                       m_allocator;
          *pdVar20 = local_3c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                     m_internal;
          pdVar20[1] = (deUint64)
                       local_3c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                       m_deviceIface;
          local_3c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
          local_3c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)0x0;
          local_3c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
               (VkDevice)0x0;
          local_3c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
               (VkAllocationCallbacks *)0x0;
          local_484 = uVar18;
          plVar21 = (long *)operator_new(0x20);
          *(undefined4 *)(plVar21 + 1) = 0;
          *(undefined4 *)((long)plVar21 + 0xc) = 0;
          *plVar21 = (long)&PTR__SharedPtrState_00d24a90;
          plVar21[2] = (long)pdVar20;
          *(undefined4 *)(plVar21 + 1) = 1;
          *(undefined4 *)((long)plVar21 + 0xc) = 1;
          pSVar5 = (local_448->
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          plVar6 = *(long **)((long)&pSVar5->m_state + lVar24);
          if (plVar6 != plVar21) {
            if (plVar6 != (long *)0x0) {
              LOCK();
              plVar6 = plVar6 + 1;
              *(int *)plVar6 = (int)*plVar6 + -1;
              UNLOCK();
              if ((int)*plVar6 == 0) {
                *(undefined8 *)((long)&pSVar5->m_ptr + lVar24) = 0;
                (**(code **)(**(long **)((long)&pSVar5->m_state + lVar24) + 0x10))();
              }
              LOCK();
              piVar22 = (int *)(*(long *)((long)&pSVar5->m_state + lVar24) + 0xc);
              *piVar22 = *piVar22 + -1;
              UNLOCK();
              if (*piVar22 == 0) {
                plVar6 = *(long **)((long)&pSVar5->m_state + lVar24);
                if (plVar6 != (long *)0x0) {
                  (**(code **)(*plVar6 + 8))();
                }
                *(undefined8 *)((long)&pSVar5->m_state + lVar24) = 0;
              }
            }
            *(deUint64 **)((long)&pSVar5->m_ptr + lVar24) = pdVar20;
            *(long **)((long)&pSVar5->m_state + lVar24) = plVar21;
            LOCK();
            *(int *)(plVar21 + 1) = (int)plVar21[1] + 1;
            UNLOCK();
            LOCK();
            piVar22 = (int *)(*(long *)((long)&pSVar5->m_state + lVar24) + 0xc);
            *piVar22 = *piVar22 + 1;
            UNLOCK();
          }
          plVar6 = plVar21 + 1;
          LOCK();
          *(int *)plVar6 = (int)*plVar6 + -1;
          UNLOCK();
          if ((int)*plVar6 == 0) {
            (**(code **)(*plVar21 + 0x10))(plVar21);
          }
          piVar22 = (int *)((long)plVar21 + 0xc);
          LOCK();
          *piVar22 = *piVar22 + -1;
          UNLOCK();
          if (*piVar22 == 0) {
            (**(code **)(*plVar21 + 8))(plVar21);
          }
          if (local_3c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0
             ) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                      (&local_3c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                       (VkPipeline)
                       local_3c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                       m_internal);
          }
          local_3c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
               (VkDevice)0x0;
          local_3c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
               (VkAllocationCallbacks *)0x0;
          local_3c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
          local_3c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)0x0;
          (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x4c])
                    (vk,commandBuffer,1,
                     **(undefined8 **)
                       ((long)&((local_448->
                                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar24));
          makeDescriptorSet(&local_478,&vk->super_DeviceInterface,
                            (this->super_SparseShaderIntrinsicsInstanceBase).
                            super_SparseResourcesBaseInstance.m_logicalDevice.
                            super_RefBase<vk::VkDevice_s_*>.m_data.object,
                            (VkDescriptorPool)
                            (this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool.
                            super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal,
                            local_238);
          pdVar20 = (deUint64 *)operator_new(0x20);
          pdVar20[2] = (deUint64)
                       local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                       m_device;
          pdVar20[3] = local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                       m_pool.m_internal;
          *pdVar20 = local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                     m_internal;
          pdVar20[1] = (deUint64)
                       local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                       m_deviceIface;
          local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
          local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)0x0;
          local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
               (VkDevice)0x0;
          local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal
               = 0;
          plVar21 = (long *)operator_new(0x20);
          *(undefined4 *)(plVar21 + 1) = 0;
          *(undefined4 *)((long)plVar21 + 0xc) = 0;
          *plVar21 = (long)&PTR__SharedPtrState_00d24b90;
          plVar21[2] = (long)pdVar20;
          *(undefined4 *)(plVar21 + 1) = 1;
          *(undefined4 *)((long)plVar21 + 0xc) = 1;
          pSVar7 = (local_2a8->
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          plVar6 = *(long **)((long)&pSVar7->m_state + lVar24);
          if (plVar6 != plVar21) {
            if (plVar6 != (long *)0x0) {
              LOCK();
              plVar6 = plVar6 + 1;
              *(int *)plVar6 = (int)*plVar6 + -1;
              UNLOCK();
              if ((int)*plVar6 == 0) {
                *(undefined8 *)((long)&pSVar7->m_ptr + lVar24) = 0;
                (**(code **)(**(long **)((long)&pSVar7->m_state + lVar24) + 0x10))();
              }
              LOCK();
              piVar22 = (int *)(*(long *)((long)&pSVar7->m_state + lVar24) + 0xc);
              *piVar22 = *piVar22 + -1;
              UNLOCK();
              if (*piVar22 == 0) {
                plVar6 = *(long **)((long)&pSVar7->m_state + lVar24);
                if (plVar6 != (long *)0x0) {
                  (**(code **)(*plVar6 + 8))();
                }
                *(undefined8 *)((long)&pSVar7->m_state + lVar24) = 0;
              }
            }
            *(deUint64 **)((long)&pSVar7->m_ptr + lVar24) = pdVar20;
            *(long **)((long)&pSVar7->m_state + lVar24) = plVar21;
            LOCK();
            *(int *)(plVar21 + 1) = (int)plVar21[1] + 1;
            UNLOCK();
            LOCK();
            piVar22 = (int *)(*(long *)((long)&pSVar7->m_state + lVar24) + 0xc);
            *piVar22 = *piVar22 + 1;
            UNLOCK();
          }
          plVar6 = plVar21 + 1;
          LOCK();
          *(int *)plVar6 = (int)*plVar6 + -1;
          UNLOCK();
          if ((int)*plVar6 == 0) {
            (**(code **)(*plVar21 + 0x10))(plVar21);
          }
          pVVar9 = local_4b8;
          piVar22 = (int *)((long)plVar21 + 0xc);
          LOCK();
          *piVar22 = *piVar22 + -1;
          UNLOCK();
          if (*piVar22 == 0) {
            (**(code **)(*plVar21 + 8))(plVar21);
          }
          if ((pointer)local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                       m_internal != (pointer)0x0) {
            local_108.m_writeDescriptorInfos.
            super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                          m_internal;
            (*(local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface
              )->_vptr_DeviceInterface[0x3d])
                      (local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                       m_deviceIface,
                       local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                       m_device,local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                                deleter.m_pool.m_internal,1,&local_108);
          }
          local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
               (VkDevice)0x0;
          local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal
               = 0;
          local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
          local_478.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)0x0;
          local_4a8 = **(undefined8 **)
                        ((long)&((this->super_SparseShaderIntrinsicsInstanceBase).descriptorSets.
                                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar24);
          dVar2 = pVVar9->arrayLayers;
          pVVar4 = (this->super_SparseShaderIntrinsicsInstanceBase).
                   super_SparseResourcesBaseInstance.m_logicalDevice.super_RefBase<vk::VkDevice_s_*>
                   .m_data.object;
          VVar17 = mapImageViewType((this->super_SparseShaderIntrinsicsInstanceBase).m_imageType);
          local_348 = 1;
          uStack_344 = (undefined4)local_4b0;
          uStack_340 = 1;
          subresourceRange_02.baseMipLevel = uStack_344;
          subresourceRange_02.aspectMask = 1;
          subresourceRange_02.levelCount = 1;
          subresourceRange_02.baseArrayLayer = 0;
          subresourceRange_02.layerCount = dVar2;
          local_338 = dVar2;
          makeImageView(&local_3e8,&vk->super_DeviceInterface,pVVar4,local_458,VVar17,pVVar9->format
                        ,subresourceRange_02);
          pdVar20 = (deUint64 *)operator_new(0x20);
          pdVar20[2] = (deUint64)
                       local_3e8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_device;
          pdVar20[3] = (deUint64)
                       local_3e8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_allocator;
          *pdVar20 = local_3e8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                     m_internal;
          pdVar20[1] = (deUint64)
                       local_3e8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_deviceIface;
          local_3e8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
          local_3e8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)0x0;
          local_3e8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
               (VkDevice)0x0;
          local_3e8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
               (VkAllocationCallbacks *)0x0;
          plVar21 = (long *)operator_new(0x20);
          *(undefined4 *)(plVar21 + 1) = 0;
          *(undefined4 *)((long)plVar21 + 0xc) = 0;
          *plVar21 = (long)&PTR__SharedPtrState_00d24850;
          plVar21[2] = (long)pdVar20;
          *(undefined4 *)(plVar21 + 1) = 1;
          *(undefined4 *)((long)plVar21 + 0xc) = 1;
          pSVar8 = (local_2b0->
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          plVar6 = *(long **)((long)&pSVar8->m_state + lVar24);
          if (plVar6 != plVar21) {
            if (plVar6 != (long *)0x0) {
              LOCK();
              plVar6 = plVar6 + 1;
              *(int *)plVar6 = (int)*plVar6 + -1;
              UNLOCK();
              if ((int)*plVar6 == 0) {
                *(undefined8 *)((long)&pSVar8->m_ptr + lVar24) = 0;
                (**(code **)(**(long **)((long)&pSVar8->m_state + lVar24) + 0x10))();
              }
              LOCK();
              piVar22 = (int *)(*(long *)((long)&pSVar8->m_state + lVar24) + 0xc);
              *piVar22 = *piVar22 + -1;
              UNLOCK();
              if (*piVar22 == 0) {
                plVar6 = *(long **)((long)&pSVar8->m_state + lVar24);
                if (plVar6 != (long *)0x0) {
                  (**(code **)(*plVar6 + 8))();
                }
                *(undefined8 *)((long)&pSVar8->m_state + lVar24) = 0;
              }
            }
            *(deUint64 **)((long)&pSVar8->m_ptr + lVar24) = pdVar20;
            *(long **)((long)&pSVar8->m_state + lVar24) = plVar21;
            LOCK();
            *(int *)(plVar21 + 1) = (int)plVar21[1] + 1;
            UNLOCK();
            LOCK();
            piVar22 = (int *)(*(long *)((long)&pSVar8->m_state + lVar24) + 0xc);
            *piVar22 = *piVar22 + 1;
            UNLOCK();
          }
          plVar6 = plVar21 + 1;
          LOCK();
          *(int *)plVar6 = (int)*plVar6 + -1;
          UNLOCK();
          if ((int)*plVar6 == 0) {
            (**(code **)(*plVar21 + 0x10))(plVar21);
          }
          piVar22 = (int *)((long)plVar21 + 0xc);
          LOCK();
          *piVar22 = *piVar22 + -1;
          UNLOCK();
          if (*piVar22 == 0) {
            (**(code **)(*plVar21 + 8))(plVar21);
          }
          if (local_3e8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0
             ) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                      (&local_3e8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                       (VkImageView)
                       local_3e8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                       m_internal);
          }
          local_3e8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
               (VkDevice)0x0;
          local_3e8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
               (VkAllocationCallbacks *)0x0;
          local_3e8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
          local_3e8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)0x0;
          local_160 = **(undefined8 **)
                        ((long)&((this->super_SparseShaderIntrinsicsInstanceBase).imageSparseViews.
                                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar24);
          local_168 = 0;
          local_158 = 1;
          pVVar4 = (this->super_SparseShaderIntrinsicsInstanceBase).
                   super_SparseResourcesBaseInstance.m_logicalDevice.super_RefBase<vk::VkDevice_s_*>
                   .m_data.object;
          VVar17 = mapImageViewType((this->super_SparseShaderIntrinsicsInstanceBase).m_imageType);
          local_360 = 1;
          uStack_35c = (undefined4)local_4b0;
          uStack_358 = 1;
          subresourceRange_03.baseMipLevel = uStack_35c;
          subresourceRange_03.aspectMask = 1;
          subresourceRange_03.levelCount = 1;
          subresourceRange_03.baseArrayLayer = 0;
          subresourceRange_03.layerCount = dVar2;
          local_350 = dVar2;
          makeImageView(&local_408,&vk->super_DeviceInterface,pVVar4,local_498,VVar17,
                        local_4b8->format,subresourceRange_03);
          pdVar20 = (deUint64 *)operator_new(0x20);
          pdVar20[2] = (deUint64)
                       local_408.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_device;
          pdVar20[3] = (deUint64)
                       local_408.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_allocator;
          *pdVar20 = local_408.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                     m_internal;
          pdVar20[1] = (deUint64)
                       local_408.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_deviceIface;
          local_408.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
          local_408.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)0x0;
          local_408.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
               (VkDevice)0x0;
          local_408.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
               (VkAllocationCallbacks *)0x0;
          plVar21 = (long *)operator_new(0x20);
          *(undefined4 *)(plVar21 + 1) = 0;
          *(undefined4 *)((long)plVar21 + 0xc) = 0;
          *plVar21 = (long)&PTR__SharedPtrState_00d24850;
          plVar21[2] = (long)pdVar20;
          *(undefined4 *)(plVar21 + 1) = 1;
          *(undefined4 *)((long)plVar21 + 0xc) = 1;
          pSVar8 = (local_2b8->
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          plVar6 = *(long **)((long)&pSVar8->m_state + lVar24);
          if (plVar6 != plVar21) {
            if (plVar6 != (long *)0x0) {
              LOCK();
              plVar6 = plVar6 + 1;
              *(int *)plVar6 = (int)*plVar6 + -1;
              UNLOCK();
              if ((int)*plVar6 == 0) {
                *(undefined8 *)((long)&pSVar8->m_ptr + lVar24) = 0;
                (**(code **)(**(long **)((long)&pSVar8->m_state + lVar24) + 0x10))();
              }
              LOCK();
              piVar22 = (int *)(*(long *)((long)&pSVar8->m_state + lVar24) + 0xc);
              *piVar22 = *piVar22 + -1;
              UNLOCK();
              if (*piVar22 == 0) {
                plVar6 = *(long **)((long)&pSVar8->m_state + lVar24);
                if (plVar6 != (long *)0x0) {
                  (**(code **)(*plVar6 + 8))();
                }
                *(undefined8 *)((long)&pSVar8->m_state + lVar24) = 0;
              }
            }
            *(deUint64 **)((long)&pSVar8->m_ptr + lVar24) = pdVar20;
            *(long **)((long)&pSVar8->m_state + lVar24) = plVar21;
            LOCK();
            *(int *)(plVar21 + 1) = (int)plVar21[1] + 1;
            UNLOCK();
            LOCK();
            piVar22 = (int *)(*(long *)((long)&pSVar8->m_state + lVar24) + 0xc);
            *piVar22 = *piVar22 + 1;
            UNLOCK();
          }
          plVar6 = plVar21 + 1;
          LOCK();
          *(int *)plVar6 = (int)*plVar6 + -1;
          UNLOCK();
          if ((int)*plVar6 == 0) {
            (**(code **)(*plVar21 + 0x10))(plVar21);
          }
          commandBuffer = local_2d0;
          piVar22 = (int *)((long)plVar21 + 0xc);
          LOCK();
          *piVar22 = *piVar22 + -1;
          UNLOCK();
          if (*piVar22 == 0) {
            (**(code **)(*plVar21 + 8))(plVar21);
          }
          if (local_408.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0
             ) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                      (&local_408.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                       (VkImageView)
                       local_408.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                       m_internal);
          }
          local_408.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
               (VkDevice)0x0;
          local_408.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
               (VkAllocationCallbacks *)0x0;
          local_408.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
          local_408.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)0x0;
          local_178 = **(undefined8 **)
                        ((long)&((this->super_SparseShaderIntrinsicsInstanceBase).imageTexelsViews.
                                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar24);
          local_180 = 0;
          local_170 = 1;
          pVVar4 = (this->super_SparseShaderIntrinsicsInstanceBase).
                   super_SparseResourcesBaseInstance.m_logicalDevice.super_RefBase<vk::VkDevice_s_*>
                   .m_data.object;
          VVar17 = mapImageViewType((this->super_SparseShaderIntrinsicsInstanceBase).m_imageType);
          VVar15 = ::vk::mapTextureFormat(local_2c0);
          local_378 = 1;
          uStack_374 = (undefined4)local_4b0;
          uStack_370 = 1;
          subresourceRange_04.baseMipLevel = uStack_374;
          subresourceRange_04.aspectMask = 1;
          subresourceRange_04.levelCount = 1;
          subresourceRange_04.baseArrayLayer = 0;
          subresourceRange_04.layerCount = dVar2;
          local_368 = dVar2;
          makeImageView(&local_428,&vk->super_DeviceInterface,pVVar4,local_4a0,VVar17,VVar15,
                        subresourceRange_04);
          pdVar20 = (deUint64 *)operator_new(0x20);
          pdVar20[2] = (deUint64)
                       local_428.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_device;
          pdVar20[3] = (deUint64)
                       local_428.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_allocator;
          *pdVar20 = local_428.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                     m_internal;
          pdVar20[1] = (deUint64)
                       local_428.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_deviceIface;
          local_428.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
          local_428.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)0x0;
          local_428.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
               (VkDevice)0x0;
          local_428.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
               (VkAllocationCallbacks *)0x0;
          plVar21 = (long *)operator_new(0x20);
          *(undefined4 *)(plVar21 + 1) = 0;
          *(undefined4 *)((long)plVar21 + 0xc) = 0;
          *plVar21 = (long)&PTR__SharedPtrState_00d24850;
          plVar21[2] = (long)pdVar20;
          *(undefined4 *)(plVar21 + 1) = 1;
          *(undefined4 *)((long)plVar21 + 0xc) = 1;
          pSVar8 = (local_450->
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          plVar6 = *(long **)((long)&pSVar8->m_state + lVar24);
          if (plVar6 != plVar21) {
            if (plVar6 != (long *)0x0) {
              LOCK();
              plVar6 = plVar6 + 1;
              *(int *)plVar6 = (int)*plVar6 + -1;
              UNLOCK();
              if ((int)*plVar6 == 0) {
                *(undefined8 *)((long)&pSVar8->m_ptr + lVar24) = 0;
                (**(code **)(**(long **)((long)&pSVar8->m_state + lVar24) + 0x10))();
              }
              LOCK();
              piVar22 = (int *)(*(long *)((long)&pSVar8->m_state + lVar24) + 0xc);
              *piVar22 = *piVar22 + -1;
              UNLOCK();
              if (*piVar22 == 0) {
                plVar6 = *(long **)((long)&pSVar8->m_state + lVar24);
                if (plVar6 != (long *)0x0) {
                  (**(code **)(*plVar6 + 8))();
                }
                *(undefined8 *)((long)&pSVar8->m_state + lVar24) = 0;
              }
            }
            *(deUint64 **)((long)&pSVar8->m_ptr + lVar24) = pdVar20;
            *(long **)((long)&pSVar8->m_state + lVar24) = plVar21;
            LOCK();
            *(int *)(plVar21 + 1) = (int)plVar21[1] + 1;
            UNLOCK();
            LOCK();
            piVar22 = (int *)(*(long *)((long)&pSVar8->m_state + lVar24) + 0xc);
            *piVar22 = *piVar22 + 1;
            UNLOCK();
          }
          plVar6 = plVar21 + 1;
          LOCK();
          *(int *)plVar6 = (int)*plVar6 + -1;
          UNLOCK();
          if ((int)*plVar6 == 0) {
            (**(code **)(*plVar21 + 0x10))(plVar21);
          }
          pVVar9 = local_4b8;
          piVar22 = (int *)((long)plVar21 + 0xc);
          LOCK();
          *piVar22 = *piVar22 + -1;
          UNLOCK();
          if (*piVar22 == 0) {
            (**(code **)(*plVar21 + 8))(plVar21);
          }
          if (local_428.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0
             ) {
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                      (&local_428.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                       (VkImageView)
                       local_428.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                       m_internal);
          }
          local_428.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
               (VkDevice)0x0;
          local_428.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
               (VkAllocationCallbacks *)0x0;
          local_428.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
          local_428.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)0x0;
          local_190 = **(undefined8 **)
                        ((long)&((local_450->
                                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar24);
          local_198 = 0;
          local_188 = 1;
          ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_108);
          uVar10 = local_4a8;
          (*(this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
            super_TestInstance._vptr_TestInstance[7])();
          ::vk::DescriptorSetUpdateBuilder::write(&local_108,(int)uVar10,(void *)0x0,0);
          ::vk::DescriptorSetUpdateBuilder::write(&local_108,(int)local_4a8,&DAT_00000001,0);
          ::vk::DescriptorSetUpdateBuilder::write(&local_108,(int)local_4a8,(void *)0x2,0);
          ::vk::DescriptorSetUpdateBuilder::update
                    (&local_108,&vk->super_DeviceInterface,
                     (this->super_SparseShaderIntrinsicsInstanceBase).
                     super_SparseResourcesBaseInstance.m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object);
          (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x56])
                    (vk,commandBuffer,1,local_258.m_internal,0,1,&local_4a8,0,0);
          uVar23 = (local_4c4 / local_47c + 1) - (uint)(local_4c4 % local_47c == 0);
          uVar30 = (uStack_4c0 / local_484 + 1) - (uint)(uStack_4c0 % local_484 == 0);
          uVar18 = (local_4bc / local_480 + 1) - (uint)(local_4bc % local_480 == 0);
          if (((0xffff < uVar23) || (0xffff < uVar30)) || (0xffff < uVar18)) {
            this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
            tcu::NotSupportedError::NotSupportedError
                      (this_01,"Image size exceeds compute invocations limit",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesShaderIntrinsicsStorage.cpp"
                       ,0x1ec);
            __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
          }
          (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x5d])
                    (vk,commandBuffer,(ulong)uVar23,(ulong)uVar30,(ulong)uVar18);
          if (local_108.m_copies.
              super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_108.m_copies.
                            super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            CONCAT44(local_108.m_copies.
                                     super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                     (deUint32)
                                     local_108.m_copies.
                                     super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) -
                            (long)local_108.m_copies.
                                  super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_108.m_writes.
              super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_108.m_writes.
                            super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_108.m_writes.
                                  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_108.m_writes.
                                  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
          ::~vector(&local_108.m_writeDescriptorInfos);
          uVar25 = local_4b0 + 1;
          lVar24 = lVar24 + 0x10;
        } while (uVar25 < pVVar9->mipLevels);
      }
      dVar3 = local_488;
      dVar2 = local_48c;
      local_390 = 1;
      dStack_388 = local_488;
      uStack_384 = 0;
      local_380 = local_48c;
      subresourceRange_05.levelCount = local_488;
      subresourceRange_05.aspectMask = 1;
      subresourceRange_05.baseMipLevel = 0;
      subresourceRange_05.baseArrayLayer = 0;
      subresourceRange_05.layerCount = local_48c;
      makeImageMemoryBarrier
                ((VkImageMemoryBarrier *)local_2a0,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
                 VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,local_498,subresourceRange_05);
      puVar26 = (undefined8 *)local_2a0;
      pDVar28 = &local_108;
      for (lVar24 = 8; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pDVar28->m_writeDescriptorInfos).
        super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar26;
        puVar26 = puVar26 + (ulong)bVar31 * -2 + 1;
        pDVar28 = (DescriptorSetUpdateBuilder *)((long)pDVar28 + ((ulong)bVar31 * -2 + 1) * 8);
      }
      local_108.m_copies.
      super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = local_260;
      local_3a8 = 1;
      dStack_3a0 = dVar3;
      uStack_39c = 0;
      local_398 = dVar2;
      subresourceRange_06.levelCount = dVar3;
      subresourceRange_06.aspectMask = 1;
      subresourceRange_06.baseMipLevel = 0;
      subresourceRange_06.baseArrayLayer = 0;
      subresourceRange_06.layerCount = dVar2;
      makeImageMemoryBarrier
                ((VkImageMemoryBarrier *)local_2a0,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
                 VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,local_4a0,subresourceRange_06);
      puVar26 = (undefined8 *)local_2a0;
      puVar29 = local_c0;
      for (lVar24 = 8; lVar24 != 0; lVar24 = lVar24 + -1) {
        *puVar29 = *puVar26;
        puVar26 = puVar26 + (ulong)bVar31 * -2 + 1;
        puVar29 = puVar29 + (ulong)bVar31 * -2 + 1;
      }
      local_80 = local_260;
      (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                (vk,commandBuffer,0x800,0x1000,0,0,0,0,0,2,&local_108);
      if (local_218.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  (&DStack_210,local_218);
      }
      if (local_440.m_counts.
          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_440.m_counts.
                        super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_440.m_counts.
                              super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_440.m_counts.
                              super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_258.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                  (&DStack_250,local_258);
      }
      if (local_238.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  (&DStack_230,local_238);
      }
      if (local_150.m_immutableSamplers.
          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.m_immutableSamplers.
                        super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_150.m_immutableSamplers.
                              super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_150.m_immutableSamplers.
                              super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_150.m_immutableSamplerInfos.
          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.m_immutableSamplerInfos.
                        super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_150.m_immutableSamplerInfos.
                              super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_150.m_immutableSamplerInfos.
                              super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_150.m_bindings.
          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.m_bindings.
                        super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_150.m_bindings.
                              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_150.m_bindings.
                              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Device does not support VK_FORMAT_R32_UINT format for storage image",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesShaderIntrinsicsStorage.cpp"
               ,0x167);
    ppuVar27 = &tcu::TestError::typeinfo;
  }
  else {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_02,"Device does not support image format for storage image"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesShaderIntrinsicsStorage.cpp"
               ,0x163);
    ppuVar27 = &tcu::NotSupportedError::typeinfo;
  }
  __cxa_throw(this_02,ppuVar27,tcu::Exception::~Exception);
}

Assistant:

void SparseShaderIntrinsicsInstanceStorage::recordCommands (const VkCommandBuffer		commandBuffer,
															const VkImageCreateInfo&	imageSparseInfo,
															const VkImage				imageSparse,
															const VkImage				imageTexels,
															const VkImage				imageResidency)
{
	const InstanceInterface&	instance		= m_context.getInstanceInterface();
	const DeviceInterface&		deviceInterface = getDeviceInterface();
	const VkPhysicalDevice		physicalDevice	= m_context.getPhysicalDevice();

	// Check if device supports image format for storage image
	if (!checkImageFormatFeatureSupport(instance, physicalDevice, imageSparseInfo.format, VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT))
		TCU_THROW(NotSupportedError, "Device does not support image format for storage image");

	// Make sure device supports VK_FORMAT_R32_UINT format for storage image
	if (!checkImageFormatFeatureSupport(instance, physicalDevice, mapTextureFormat(m_residencyFormat), VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT))
		TCU_THROW(TestError, "Device does not support VK_FORMAT_R32_UINT format for storage image");

	pipelines.resize(imageSparseInfo.mipLevels);
	descriptorSets.resize(imageSparseInfo.mipLevels);
	imageSparseViews.resize(imageSparseInfo.mipLevels);
	imageTexelsViews.resize(imageSparseInfo.mipLevels);
	imageResidencyViews.resize(imageSparseInfo.mipLevels);

	// Create descriptor set layout
	DescriptorSetLayoutBuilder descriptorLayerBuilder;

	descriptorLayerBuilder.addSingleBinding(imageSparseDescType(), VK_SHADER_STAGE_COMPUTE_BIT);
	descriptorLayerBuilder.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT);
	descriptorLayerBuilder.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT);

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(descriptorLayerBuilder.build(deviceInterface, getDevice()));

	// Create pipeline layout
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(deviceInterface, getDevice(), *descriptorSetLayout));

	// Create descriptor pool
	DescriptorPoolBuilder descriptorPoolBuilder;

	descriptorPoolBuilder.addType(imageSparseDescType(), imageSparseInfo.mipLevels);
	descriptorPoolBuilder.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, imageSparseInfo.mipLevels);
	descriptorPoolBuilder.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, imageSparseInfo.mipLevels);

	descriptorPool = descriptorPoolBuilder.build(deviceInterface, getDevice(), VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, imageSparseInfo.mipLevels);

	const VkImageSubresourceRange fullImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, imageSparseInfo.mipLevels, 0u, imageSparseInfo.arrayLayers);

	{
		VkImageMemoryBarrier imageShaderAccessBarriers[3];

		imageShaderAccessBarriers[0] = makeImageMemoryBarrier
		(
			VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_ACCESS_SHADER_READ_BIT,
			VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			VK_IMAGE_LAYOUT_GENERAL,
			imageSparse,
			fullImageSubresourceRange
		);

		imageShaderAccessBarriers[1] = makeImageMemoryBarrier
		(
			0u,
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED,
			VK_IMAGE_LAYOUT_GENERAL,
			imageTexels,
			fullImageSubresourceRange
		);

		imageShaderAccessBarriers[2] = makeImageMemoryBarrier
		(
			0u,
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED,
			VK_IMAGE_LAYOUT_GENERAL,
			imageResidency,
			fullImageSubresourceRange
		);

		deviceInterface.cmdPipelineBarrier(commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 3u, imageShaderAccessBarriers);
	}

	const VkSpecializationMapEntry specializationMapEntries[6] =
	{
		{ 1u, 0u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // GridSize.x
		{ 2u, 1u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // GridSize.y
		{ 3u, 2u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // GridSize.z
		{ 4u, 3u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // WorkGroupSize.x
		{ 5u, 4u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // WorkGroupSize.y
		{ 6u, 5u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // WorkGroupSize.z
	};

	Unique<VkShaderModule> shaderModule(createShaderModule(deviceInterface, getDevice(), m_context.getBinaryCollection().get("compute"), 0u));

	for (deUint32 mipLevelNdx = 0u; mipLevelNdx < imageSparseInfo.mipLevels; ++mipLevelNdx)
	{
		const tcu::UVec3  gridSize				= getShaderGridSize(m_imageType, m_imageSize, mipLevelNdx);
		const tcu::UVec3  workGroupSize			= computeWorkGroupSize(gridSize);
		const tcu::UVec3 specializationData[2]	= { gridSize, workGroupSize };

		const VkSpecializationInfo specializationInfo =
		{
			(deUint32)DE_LENGTH_OF_ARRAY(specializationMapEntries),	// mapEntryCount
			specializationMapEntries,								// pMapEntries
			sizeof(specializationData),								// dataSize
			specializationData,										// pData
		};

		// Create and bind compute pipeline
		pipelines[mipLevelNdx] = makeVkSharedPtr(makeComputePipeline(deviceInterface, getDevice(), *pipelineLayout, *shaderModule, &specializationInfo));
		const VkPipeline computePipeline = **pipelines[mipLevelNdx];

		deviceInterface.cmdBindPipeline(commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, computePipeline);

		// Create descriptor set
		descriptorSets[mipLevelNdx] = makeVkSharedPtr(makeDescriptorSet(deviceInterface, getDevice(), *descriptorPool, *descriptorSetLayout));
		const VkDescriptorSet descriptorSet = **descriptorSets[mipLevelNdx];

		// Bind resources
		const VkImageSubresourceRange mipLevelRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, mipLevelNdx, 1u, 0u, imageSparseInfo.arrayLayers);

		imageSparseViews[mipLevelNdx] = makeVkSharedPtr(makeImageView(deviceInterface, getDevice(), imageSparse, mapImageViewType(m_imageType), imageSparseInfo.format, mipLevelRange));
		const VkDescriptorImageInfo imageSparseDescInfo = makeDescriptorImageInfo(DE_NULL, **imageSparseViews[mipLevelNdx], VK_IMAGE_LAYOUT_GENERAL);

		imageTexelsViews[mipLevelNdx] = makeVkSharedPtr(makeImageView(deviceInterface, getDevice(), imageTexels, mapImageViewType(m_imageType), imageSparseInfo.format, mipLevelRange));
		const VkDescriptorImageInfo imageTexelsDescInfo = makeDescriptorImageInfo(DE_NULL, **imageTexelsViews[mipLevelNdx], VK_IMAGE_LAYOUT_GENERAL);

		imageResidencyViews[mipLevelNdx] = makeVkSharedPtr(makeImageView(deviceInterface, getDevice(), imageResidency, mapImageViewType(m_imageType), mapTextureFormat(m_residencyFormat), mipLevelRange));
		const VkDescriptorImageInfo imageResidencyDescInfo = makeDescriptorImageInfo(DE_NULL, **imageResidencyViews[mipLevelNdx], VK_IMAGE_LAYOUT_GENERAL);

		DescriptorSetUpdateBuilder descriptorUpdateBuilder;
		descriptorUpdateBuilder.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(BINDING_IMAGE_SPARSE), imageSparseDescType(), &imageSparseDescInfo);
		descriptorUpdateBuilder.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(BINDING_IMAGE_TEXELS), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &imageTexelsDescInfo);
		descriptorUpdateBuilder.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(BINDING_IMAGE_RESIDENCY), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &imageResidencyDescInfo);

		descriptorUpdateBuilder.update(deviceInterface, getDevice());

		deviceInterface.cmdBindDescriptorSets(commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);

		const deUint32		xWorkGroupCount = gridSize.x() / workGroupSize.x() + (gridSize.x() % workGroupSize.x() ? 1u : 0u);
		const deUint32		yWorkGroupCount = gridSize.y() / workGroupSize.y() + (gridSize.y() % workGroupSize.y() ? 1u : 0u);
		const deUint32		zWorkGroupCount = gridSize.z() / workGroupSize.z() + (gridSize.z() % workGroupSize.z() ? 1u : 0u);
		const tcu::UVec3	maxWorkGroupCount = tcu::UVec3(65535u, 65535u, 65535u);

		if (maxWorkGroupCount.x() < xWorkGroupCount ||
			maxWorkGroupCount.y() < yWorkGroupCount ||
			maxWorkGroupCount.z() < zWorkGroupCount)
		{
			TCU_THROW(NotSupportedError, "Image size exceeds compute invocations limit");
		}

		deviceInterface.cmdDispatch(commandBuffer, xWorkGroupCount, yWorkGroupCount, zWorkGroupCount);
	}

	{
		VkImageMemoryBarrier imageOutputTransferSrcBarriers[2];

		imageOutputTransferSrcBarriers[0] = makeImageMemoryBarrier
		(
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_GENERAL,
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			imageTexels,
			fullImageSubresourceRange
		);

		imageOutputTransferSrcBarriers[1] = makeImageMemoryBarrier
		(
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_GENERAL,
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			imageResidency,
			fullImageSubresourceRange
		);

		deviceInterface.cmdPipelineBarrier(commandBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 2u, imageOutputTransferSrcBarriers);
	}
}